

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Ed25519.c
# Opt level: O3

_Bool Hacl_Ed25519_verify(uint8_t *public,uint8_t *msg,uint32_t len1,uint8_t *signature)

{
  _Bool _Var1;
  uint8_t *rs;
  uint64_t tmp_1 [20];
  uint64_t r_ [5];
  uint64_t local_448;
  long local_440;
  long local_438;
  long local_430;
  long local_428;
  uint64_t local_420;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  uint64_t local_3f8;
  long local_3f0;
  long lStack_3e8;
  long local_3e0;
  long lStack_3d8;
  uint64_t local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  undefined7 local_3a8;
  undefined1 uStack_3a1;
  undefined6 uStack_3a0;
  undefined1 local_39a;
  undefined6 uStack_399;
  undefined1 uStack_393;
  undefined6 uStack_392;
  undefined4 local_38c;
  uint64_t local_388 [20];
  uint64_t local_2e8 [20];
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  uint64_t local_218 [4];
  undefined8 local_1f8;
  uint64_t local_178 [5];
  uint64_t local_150 [5];
  uint64_t local_128 [10];
  uint64_t local_d8 [5];
  uint64_t local_b0 [5];
  uint64_t local_88 [11];
  
  memset(local_388,0,0x140);
  _Var1 = Hacl_Impl_Ed25519_PointDecompress_point_decompress(local_388,public);
  if (!_Var1) {
    return false;
  }
  _Var1 = Hacl_Impl_Ed25519_PointDecompress_point_decompress(local_2e8,signature);
  if (_Var1) {
    local_248 = *(ulong *)(signature + 0x20) & 0xffffffffffffff;
    local_240 = *(ulong *)(signature + 0x27) & 0xffffffffffffff;
    local_238 = *(ulong *)(signature + 0x2e) & 0xffffffffffffff;
    local_230 = *(ulong *)(signature + 0x35) & 0xffffffffffffff;
    local_228 = (ulong)*(uint *)(signature + 0x3c);
    if ((local_228 < 0x10000001) &&
       ((*(uint *)(signature + 0x3c) != 0x10000000 ||
        ((local_238 < 0x14df && local_230 == 0 &&
         ((local_238 != 0x14de ||
          ((local_240 < 0xf9dea2f79cd659 &&
           (local_240 != 0xf9dea2f79cd658 || local_248 < 0x12631a5cf5d3ed)))))))))) {
      local_218[2] = 0;
      local_218[3] = 0;
      local_218[0] = 0;
      local_218[1] = 0;
      local_1f8 = 0;
      Hacl_Impl_SHA512_ModQ_sha512_modq_pre_pre2(local_218,signature,public,msg,len1);
      local_3a8 = (undefined7)local_218[0];
      uStack_3a1 = (undefined1)local_218[1];
      uStack_3a0 = (undefined6)(local_218[1] >> 8);
      local_39a = (undefined1)local_218[2];
      uStack_399 = (undefined6)(local_218[2] >> 8);
      uStack_393 = (undefined1)local_218[3];
      uStack_392 = (undefined6)(local_218[3] >> 8);
      local_38c = (undefined4)local_1f8;
      memset(local_218,0,0x1e0);
      local_448 = 0x62d608f25d51a;
      local_440 = 0x412a4b4f6592a;
      local_438 = 0x75b7171a4b31d;
      local_430 = 0x1ff60527118fe;
      local_428 = 0x216936d3cd6e5;
      local_420 = 0x6666666666658;
      local_418 = 0x4cccccccccccc;
      local_410 = 0x1999999999999;
      local_408 = 0x3333333333333;
      local_400 = 0x6666666666666;
      local_3f8 = 1;
      local_3f0 = 0;
      lStack_3e8 = 0;
      local_3e0 = 0;
      lStack_3d8 = 0;
      local_3d0 = 0x68ab3a5b7dda3;
      local_3c8 = 0xeea2a5eadbb;
      local_3c0 = 0x2af8df483c27e;
      local_3b8 = 0x332b375274732;
      local_3b0 = 0x67875f0fd78b7;
      Hacl_Impl_Ed25519_Ladder_point_mul(local_d8,signature + 0x20,&local_448);
      Hacl_Impl_Ed25519_Ladder_point_mul(local_218,(uint8_t *)&local_3a8,local_388);
      Hacl_Impl_Ed25519_PointAdd_point_add(local_178,local_2e8,local_218);
      memset(&local_448,0,0xa0);
      Hacl_Bignum25519_fmul(&local_448,local_d8,local_128);
      Hacl_Bignum25519_reduce(&local_448);
      Hacl_Bignum25519_fmul(&local_420,local_178,local_88);
      Hacl_Bignum25519_reduce(&local_420);
      if (local_448 != local_420) {
        return false;
      }
      if (local_440 != local_418) {
        return false;
      }
      if (local_438 != local_410) {
        return false;
      }
      if (local_430 != local_408) {
        return false;
      }
      if (local_428 != local_400) {
        return false;
      }
      Hacl_Bignum25519_fmul(&local_3f8,local_b0,local_128);
      Hacl_Bignum25519_reduce(&local_3f8);
      Hacl_Bignum25519_fmul(&local_3d0,local_150,local_88);
      Hacl_Bignum25519_reduce(&local_3d0);
      if (local_3f8 == local_3d0) {
        return local_3b0 == lStack_3d8 &&
               (local_3b8 == local_3e0 && (local_3c0 == lStack_3e8 && local_3f0 == local_3c8));
      }
    }
  }
  return false;
}

Assistant:

bool Hacl_Ed25519_verify(uint8_t *public, uint8_t *msg, uint32_t len1, uint8_t *signature)
{
  return Hacl_Impl_Ed25519_Verify_verify(public, msg, len1, signature);
}